

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_convert_db.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  DatabaseInterface *pDVar4;
  unsigned_long *hash;
  pointer puVar5;
  uint i;
  uint uVar6;
  ulong uVar7;
  char *__format;
  ulong uVar8;
  char **ppcVar9;
  bool bVar10;
  size_t blob_size;
  size_t hash_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  allocator_type local_89;
  ulong local_88;
  DatabaseInterface *local_80;
  size_type local_78;
  size_type local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  pointer local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (argc != 3) {
    main_cold_1();
    return 1;
  }
  ppcVar9 = argv + 1;
  uVar3 = 1;
  pDVar4 = Fossilize::create_database(argv[1],ReadOnly);
  local_80 = Fossilize::create_database(argv[2],OverWrite);
  __format = "Fossilize ERROR: Failed to load database: %s\n";
  if ((pDVar4 != (DatabaseInterface *)0x0) &&
     (iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4), (char)iVar2 != '\0')) {
    ppcVar9 = argv + 2;
    __format = "Fossilize ERROR: Failed to open database for writing: %s\n";
    if ((local_80 != (DatabaseInterface *)0x0) &&
       (iVar2 = (*local_80->_vptr_DatabaseInterface[2])(), (char)iVar2 != '\0')) {
      uVar8 = 0;
      uVar7 = 0;
      do {
        local_70 = 0;
        iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar7,&local_70,0);
        bVar10 = true;
        uVar3 = 1;
        if ((char)iVar2 != '\0') {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_48,local_70,(allocator_type *)&local_68);
          iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar7,&local_70);
          if ((char)iVar2 == '\0') {
            local_88 = 1;
            bVar10 = false;
          }
          else {
            bVar10 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start ==
                     local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_88 = uVar8;
            local_50 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            puVar5 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            while (!bVar10) {
              local_78 = 0;
              cVar1 = '\0';
              iVar2 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,uVar7,*puVar5,&local_78,0,0);
              if ((char)iVar2 == '\0') {
                local_88 = 1;
                uVar8 = local_88;
              }
              else {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&local_68,local_78,&local_89);
                cVar1 = '\0';
                iVar2 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,uVar7,*puVar5);
                if ((char)iVar2 == '\0') {
                  uVar8 = 1;
                }
                else {
                  iVar2 = (*local_80->_vptr_DatabaseInterface[4])(local_80,uVar7,*puVar5);
                  cVar1 = (char)iVar2;
                  uVar8 = local_88 & 0xffffffff;
                  if (cVar1 == '\0') {
                    uVar8 = 1;
                  }
                }
                if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              local_88 = uVar8;
              if (cVar1 == '\0') break;
              puVar5 = puVar5 + 1;
              bVar10 = puVar5 == local_50;
            }
          }
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar10 = (bool)(bVar10 ^ 1);
          uVar3 = (uint)local_88;
        }
        if (bVar10) break;
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        uVar8 = (ulong)uVar3;
      } while (uVar6 != 10);
      goto LAB_0010ec06;
    }
  }
  fprintf(_stderr,__format,*ppcVar9);
LAB_0010ec06:
  if (local_80 != (DatabaseInterface *)0x0) {
    (*local_80->_vptr_DatabaseInterface[1])();
  }
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
  }
  return uVar3;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 3)
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(argv[1], DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(argv[2], DatabaseMode::OverWrite));
	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return EXIT_FAILURE;
		std::vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
			return EXIT_FAILURE;

		for (auto &hash : hashes)
		{
			size_t blob_size = 0;
			if (!input_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;
			std::vector<uint8_t> blob(blob_size);
			if (!input_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;

			if (!output_db->write_entry(tag, hash, blob.data(), blob.size(),
					PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT |
					PAYLOAD_WRITE_COMPRESS_BIT |
					PAYLOAD_WRITE_BEST_COMPRESSION_BIT))
			{
				return EXIT_FAILURE;
			}
		}
	}
}